

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

size_t vectorread32le<std::shared_ptr<ReadWriter>>
                 (shared_ptr<ReadWriter> *rd,DwordVector *v,size_t n)

{
  uint uVar1;
  element_type *peVar2;
  reference pvVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  size_type sVar5;
  size_t nr;
  size_t n_local;
  DwordVector *v_local;
  shared_ptr<ReadWriter> *rd_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(v,n);
  peVar2 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](v,0);
  uVar1 = (*peVar2->_vptr_ReadWriter[2])(peVar2,pvVar3,n << 2);
  if ((uVar1 & 3) != 0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "read partial uint32_t";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (v,CONCAT44(extraout_var,uVar1) >> 2);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(v);
  return sVar5;
}

Assistant:

size_t vectorread32le(PTR rd, DwordVector& v, size_t n)
{
    v.resize(n);

    size_t nr= rd->read((uint8_t*)&v[0], n*sizeof(uint32_t));
    if (nr%sizeof(uint32_t))
        throw "read partial uint32_t";
    v.resize(nr/sizeof(uint32_t));
#if __BYTE_ORDER == __BIG_ENDIAN
#ifdef __GXX_EXPERIMENTAL_CXX0X__
    std::for_each(v.begin(), v.end(), [](uint32_t& x) { x= swab32(x);});
#else
    throw "need c++0x";
#endif
#endif
    return v.size();
}